

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  RemoveConst<kj::CidrRange> *pRVar1;
  NetworkFilter *pNVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  long lVar7;
  CidrRange *pCVar8;
  uint uVar9;
  CidrRange *cidr;
  bool bVar10;
  bool bVar11;
  ArrayPtr<const_char> AVar12;
  ArrayPtr<const_kj::CidrRange> AVar13;
  Fault f;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint local_64;
  Fault local_60;
  DebugComparison<unsigned_int_&,_unsigned_long> local_58;
  
  local_58.left = &local_64;
  local_58.result = addrlen >= 2;
  local_58.right = 2;
  local_58.op.content.ptr = " >= ";
  local_58.op.content.size_ = 5;
  local_64 = addrlen;
  if (addrlen < 2) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xc39,FAILED,"addrlen >= sizeof(addr->sa_family)","_kjCondition,",&local_58);
    Debug::Fault::fatal(&local_60);
  }
  if (addr->sa_family == 1) {
    AVar12 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar12.size_ == 0) || (*AVar12.ptr != '\0')) {
      lVar7 = 0x48;
    }
    else {
      lVar7 = 0x49;
    }
    return (bool)*(undefined1 *)((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lVar7);
  }
  if ((this->allowPublic == true) && ((addr->sa_family | 8) == 10)) {
    AVar13 = privateCidrs();
    pCVar8 = AVar13.ptr;
    bVar10 = AVar13.size_ != 0;
    if ((bVar10) && (bVar3 = CidrRange::matches(pCVar8,addr), !bVar3)) {
      lVar7 = AVar13.size_ * 0x18;
      do {
        lVar7 = lVar7 + -0x18;
        pCVar8 = pCVar8 + 1;
        bVar10 = lVar7 != 0;
        if (lVar7 == 0) break;
        bVar3 = CidrRange::matches(pCVar8,addr);
      } while (!bVar3);
    }
    if (!bVar10) {
      AVar13 = localCidrs();
      pCVar8 = AVar13.ptr;
      bVar10 = AVar13.size_ != 0;
      if ((bVar10) && (bVar3 = CidrRange::matches(pCVar8,addr), !bVar3)) {
        lVar7 = AVar13.size_ * 0x18;
        do {
          lVar7 = lVar7 + -0x18;
          pCVar8 = pCVar8 + 1;
          bVar10 = lVar7 != 0;
          if (lVar7 == 0) break;
          bVar3 = CidrRange::matches(pCVar8,addr);
        } while (!bVar3);
      }
      if (!bVar10) {
        AVar13 = reservedCidrs();
        pCVar8 = AVar13.ptr;
        bVar10 = AVar13.size_ != 0;
        if ((bVar10) && (bVar3 = CidrRange::matches(pCVar8,addr), !bVar3)) {
          lVar7 = AVar13.size_ * 0x18;
          do {
            lVar7 = lVar7 + -0x18;
            pCVar8 = pCVar8 + 1;
            bVar10 = lVar7 != 0;
            if (lVar7 == 0) break;
            bVar3 = CidrRange::matches(pCVar8,addr);
          } while (!bVar3);
        }
        bVar10 = (bool)(bVar10 ^ 1);
        goto LAB_004880a2;
      }
    }
  }
  bVar10 = false;
LAB_004880a2:
  bVar3 = bVar10;
  if ((this->allowNetwork == true) && ((addr->sa_family | 8) == 10)) {
    AVar13 = localCidrs();
    pCVar8 = AVar13.ptr;
    bVar11 = AVar13.size_ != 0;
    if ((bVar11) && (bVar4 = CidrRange::matches(pCVar8,addr), !bVar4)) {
      lVar7 = AVar13.size_ * 0x18;
      do {
        lVar7 = lVar7 + -0x18;
        pCVar8 = pCVar8 + 1;
        bVar11 = lVar7 != 0;
        if (lVar7 == 0) break;
        bVar4 = CidrRange::matches(pCVar8,addr);
      } while (!bVar4);
    }
    if (!bVar11) {
      AVar13 = reservedCidrs();
      pCVar8 = AVar13.ptr;
      bVar11 = AVar13.size_ != 0;
      if ((bVar11) && (bVar3 = CidrRange::matches(pCVar8,addr), !bVar3)) {
        lVar7 = AVar13.size_ * 0x18;
        do {
          lVar7 = lVar7 + -0x18;
          pCVar8 = pCVar8 + 1;
          bVar11 = lVar7 != 0;
          if (lVar7 == 0) break;
          bVar3 = CidrRange::matches(pCVar8,addr);
        } while (!bVar3);
      }
      bVar3 = true;
      if (bVar11) {
        bVar3 = bVar10;
      }
    }
  }
  pRVar1 = (this->allowCidrs).builder.pos;
  uVar9 = 0;
  for (pCVar8 = (this->allowCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
    bVar10 = CidrRange::matches(pCVar8,addr);
    if (bVar10) {
      if (uVar9 <= pCVar8->bitCount) {
        uVar9 = pCVar8->bitCount;
      }
      bVar3 = true;
    }
  }
  if (bVar3) {
    pRVar1 = (this->denyCidrs).builder.pos;
    for (pCVar8 = (this->denyCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
      bVar10 = CidrRange::matches(pCVar8,addr);
      if ((bVar10) && (uVar9 <= pCVar8->bitCount)) goto LAB_004881d7;
    }
    pNVar2 = (this->next).ptr;
    if (pNVar2 == (NetworkFilter *)0x0) {
      uVar5 = 1;
    }
    else {
      iVar6 = (**(pNVar2->super_NetworkFilter)._vptr_NetworkFilter)(pNVar2,addr,(ulong)local_64);
      uVar5 = (undefined1)iVar6;
    }
  }
  else {
LAB_004881d7:
    uVar5 = 0;
  }
  return (bool)uVar5;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;

  if (allowPublic) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(privateCidrs(), addr) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  if (allowNetwork) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_SOME(n, next) {
    return n.shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}